

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int killmatches(int cond)

{
  mgwin *pmVar1;
  int iVar2;
  char *__string;
  line *plVar3;
  uint local_34;
  
  plVar3 = curwp->w_dotp;
  if (curwp->w_doto == plVar3->l_used) {
    plVar3 = plVar3->l_fp;
  }
  local_34 = 0;
  do {
    while( true ) {
      if (plVar3 == curbp->b_headp) {
        ewprintf("%d line(s) deleted",(ulong)local_34);
        if (local_34 == 0) {
          return 1;
        }
        curwp->w_rflag = curwp->w_rflag | 2;
        return 1;
      }
      regex_match[0].rm_so = 0;
      regex_match[0].rm_eo = plVar3->l_used;
      __string = plVar3->l_text;
      if (__string == (char *)0x0) {
        __string = "";
      }
      iVar2 = regexec((regex_t *)&regex_buff,__string,10,(regmatch_t *)regex_match,4);
      pmVar1 = curwp;
      if ((cond == 0 && iVar2 != 0) || (cond == 1 && iVar2 == 0)) break;
      plVar3 = plVar3->l_fp;
    }
    curwp->w_doto = 0;
    pmVar1->w_dotp = plVar3;
    local_34 = local_34 + 1;
    iVar2 = ldelete(plVar3->l_used + 1,0);
    plVar3 = curwp->w_dotp;
    curwp->w_rflag = curwp->w_rflag | 2;
  } while (iVar2 != 0);
  return 0;
}

Assistant:

static int
killmatches(int cond)
{
	int	 s, error;
	int	 count = 0;
	struct line	*clp;

	clp = curwp->w_dotp;
	if (curwp->w_doto == llength(clp))
		/* Consider dot on next line */
		clp = lforw(clp);

	while (clp != (curbp->b_headp)) {
		/* see if line matches */
		regex_match[0].rm_so = 0;
		regex_match[0].rm_eo = llength(clp);
		error = regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, REG_STARTEND);

		/* Delete line when appropriate */
		if ((cond == FALSE && error) || (cond == TRUE && !error)) {
			curwp->w_doto = 0;
			curwp->w_dotp = clp;
			count++;
			s = ldelete(llength(clp) + 1, KNONE);
			clp = curwp->w_dotp;
			curwp->w_rflag |= WFMOVE;
			if (s == FALSE)
				return (FALSE);
		} else
			clp = lforw(clp);
	}

	ewprintf("%d line(s) deleted", count);
	if (count > 0)
		curwp->w_rflag |= WFMOVE;

	return (TRUE);
}